

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-core.c
# Opt level: O3

errr cmdq_push_repeat(cmd_code c,wchar_t nrepeats)

{
  errr eVar1;
  long lVar2;
  command_conflict cmd;
  command_conflict cStack_c8;
  
  lVar2 = 0;
  memset(&cStack_c8,0,0xb0);
  do {
    if (*(cmd_code *)((long)&game_cmds[0].cmd + lVar2) == c) {
      cStack_c8.code = c;
      cStack_c8.nrepeats = nrepeats;
      eVar1 = cmdq_push_copy(&cStack_c8);
      return eVar1;
    }
    lVar2 = lVar2 + 0x20;
  } while (lVar2 != 0xdc0);
  return 1;
}

Assistant:

errr cmdq_push_repeat(cmd_code c, int nrepeats)
{
	struct command cmd = {
		.context = CTX_INIT,
		.code = CMD_NULL,
		.nrepeats = 0,
		.is_background_command = false,
		.arg = { { 0 } }
	};

	if (cmd_idx(c) == -1)
		return 1;

	cmd.code = c;
	cmd.nrepeats = nrepeats;

	return cmdq_push_copy(&cmd);
}